

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O1

VkBufferImageCopy *
vkt::synchronization::makeBufferImageCopy
          (VkBufferImageCopy *__return_storage_ptr__,VkImageSubresourceLayers subresourceLayers,
          VkExtent3D extent)

{
  __return_storage_ptr__->bufferOffset = 0;
  __return_storage_ptr__->bufferRowLength = 0;
  __return_storage_ptr__->bufferImageHeight = 0;
  (__return_storage_ptr__->imageSubresource).aspectMask = (int)subresourceLayers._0_8_;
  (__return_storage_ptr__->imageSubresource).mipLevel =
       (int)((ulong)subresourceLayers._0_8_ >> 0x20);
  (__return_storage_ptr__->imageSubresource).baseArrayLayer = (int)subresourceLayers._8_8_;
  (__return_storage_ptr__->imageSubresource).layerCount =
       (int)((ulong)subresourceLayers._8_8_ >> 0x20);
  (__return_storage_ptr__->imageOffset).x = 0;
  (__return_storage_ptr__->imageOffset).y = 0;
  (__return_storage_ptr__->imageOffset).z = 0;
  (__return_storage_ptr__->imageExtent).width = (int)extent._0_8_;
  (__return_storage_ptr__->imageExtent).height = (int)((ulong)extent._0_8_ >> 0x20);
  (__return_storage_ptr__->imageExtent).depth = extent.depth;
  return __return_storage_ptr__;
}

Assistant:

VkBufferImageCopy makeBufferImageCopy (const VkImageSubresourceLayers	subresourceLayers,
									   const VkExtent3D					extent)
{
	const VkBufferImageCopy copyParams =
	{
		0ull,										//	VkDeviceSize				bufferOffset;
		0u,											//	deUint32					bufferRowLength;
		0u,											//	deUint32					bufferImageHeight;
		subresourceLayers,							//	VkImageSubresourceLayers	imageSubresource;
		makeOffset3D(0, 0, 0),						//	VkOffset3D					imageOffset;
		extent,										//	VkExtent3D					imageExtent;
	};
	return copyParams;
}